

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

RegExp * __thiscall re2c::Scanner::ichr(Scanner *this,uint32_t c)

{
  re2c *this_00;
  RegExp *pRVar1;
  RegExp *e2;
  
  if ((c & 0xffffffdf) - 0x41 < 0x1a) {
    this_00 = (re2c *)schr(this,c | 0x20);
    pRVar1 = schr(this,c & 0xffffffdf);
    pRVar1 = mkAlt(this_00,pRVar1,e2);
    return pRVar1;
  }
  pRVar1 = schr(this,c);
  return pRVar1;
}

Assistant:

RegExp *Scanner::ichr(uint32_t c) const
{
	if (is_alpha(c)) {
		RegExp *l = schr(to_lower_unsafe(c));
		RegExp *u = schr(to_upper_unsafe(c));
		return mkAlt(l, u);
	} else {
		return schr(c);
	}
}